

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_custom_check.cpp
# Opt level: O1

void __thiscall money_t::~money_t(money_t *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_money_t = (_func_int **)&PTR__money_t_00109d90;
  pcVar2 = (this->currency_)._M_dataplus._M_p;
  paVar1 = &(this->currency_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~money_t() {}